

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

FArrayBox * amrex::VisMF::readFAB(int idx,string *mf_name,Header *hdr,int whichComp)

{
  bool bVar1;
  int iVar2;
  BaseFab<double> *this;
  ifstream *is;
  double *out;
  Long LVar3;
  RealDescriptor *pRVar4;
  int iVar5;
  RealDescriptor *this_00;
  string FullName;
  Box fab_box;
  
  BoxArray::operator[](&fab_box,&hdr->m_ba,idx);
  iVar2 = (hdr->m_ngrow).vect[0];
  iVar5 = (hdr->m_ngrow).vect[1];
  if (iVar5 < iVar2) {
    iVar5 = iVar2;
  }
  iVar2 = (hdr->m_ngrow).vect[2];
  if (iVar5 <= iVar2) {
    iVar5 = iVar2;
  }
  if (0 < iVar5) {
    Box::grow(&fab_box,&hdr->m_ngrow);
  }
  this = (BaseFab<double> *)operator_new(0x48);
  iVar2 = 1;
  if (whichComp == -1) {
    iVar2 = hdr->m_ncomp;
  }
  FArrayBox::FArrayBox((FArrayBox *)this,&fab_box,iVar2,true,false,(Arena *)0x0);
  DirName(&FullName,mf_name);
  std::__cxx11::string::append((string *)&FullName);
  is = OpenStream(&FullName);
  std::istream::seekg((long)is,(_Ios_Seekdir)
                               (hdr->m_fod).
                               super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                               .
                               super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                               ._M_impl.super__Vector_impl_data._M_start[idx].m_head);
  if (hdr->m_vers == 1) {
    if (whichComp == -1) {
      FArrayBox::readFrom((FArrayBox *)this,(istream *)is);
    }
    else {
      FArrayBox::readFrom((FArrayBox *)this,(istream *)is,whichComp);
    }
  }
  else {
    out = BaseFab<double>::dataPtr(this,0);
    if (whichComp == -1) {
      pRVar4 = FPC::NativeRealDescriptor();
      bVar1 = RealDescriptor::operator==(&hdr->m_writtenRD,pRVar4);
      if (bVar1) {
        std::istream::read((char *)is,(long)out);
      }
      else {
        LVar3 = Box::numPts(&this->domain);
        RealDescriptor::convertToNativeFormat
                  (out,this->nvar * LVar3,(istream *)is,&hdr->m_writtenRD);
      }
    }
    else {
      LVar3 = Box::numPts(&this->domain);
      this_00 = &hdr->m_writtenRD;
      iVar2 = RealDescriptor::numBytes(this_00);
      std::istream::seekg((long)is,whichComp * (int)LVar3 * iVar2);
      pRVar4 = FPC::NativeRealDescriptor();
      bVar1 = RealDescriptor::operator==(this_00,pRVar4);
      if (bVar1) {
        std::istream::read((char *)is,(long)out);
      }
      else {
        LVar3 = Box::numPts(&this->domain);
        RealDescriptor::convertToNativeFormat(out,LVar3,(istream *)is,this_00);
      }
    }
  }
  CloseStream(&FullName,false);
  std::__cxx11::string::~string((string *)&FullName);
  return (FArrayBox *)this;
}

Assistant:

FArrayBox*
VisMF::readFAB (int                  idx,
                const std::string   &mf_name,
                const VisMF::Header &hdr,
                int                  whichComp)
{
//    BL_PROFILE("VisMF::readFAB_idx");
    Box fab_box(hdr.m_ba[idx]);
    if(hdr.m_ngrow.max() > 0) {
        fab_box.grow(hdr.m_ngrow);
    }

    FArrayBox *fab = new FArrayBox(fab_box, whichComp == -1 ? hdr.m_ncomp : 1);

    std::string FullName(VisMF::DirName(mf_name));
    FullName += hdr.m_fod[idx].m_name;

    std::ifstream *infs = VisMF::OpenStream(FullName);
    infs->seekg(hdr.m_fod[idx].m_head, std::ios::beg);

    if(hdr.m_vers == Header::Version_v1) {
      if(whichComp == -1) {    // ---- read all components
        fab->readFrom(*infs);
      } else {
        fab->readFrom(*infs, whichComp);
      }
    } else {
      Real* fabdata = fab->dataPtr();
#ifdef AMREX_USE_GPU
      std::unique_ptr<FArrayBox> hostfab;
      if (fab->arena()->isManaged() || fab->arena()->isDevice()) {
          hostfab = std::make_unique<FArrayBox>(fab->box(), fab->nComp(), The_Pinned_Arena());
          fabdata = hostfab->dataPtr();
      }
#endif
      if(whichComp == -1) {    // ---- read all components
        if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
          infs->read((char *) fabdata, fab->nBytes());
        } else {
          Long readDataItems(fab->box().numPts() * fab->nComp());
          RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                                *infs, hdr.m_writtenRD);
        }

      } else {
        Long bytesPerComp(fab->box().numPts() * hdr.m_writtenRD.numBytes());
        infs->seekg(bytesPerComp * whichComp, std::ios::cur);
        if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
          infs->read((char *) fabdata, bytesPerComp);
        } else {
          Long readDataItems(fab->box().numPts());  // ---- one component only
          RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                                *infs, hdr.m_writtenRD);
        }
      }
#ifdef AMREX_USE_GPU
      if (hostfab) {
          Gpu::htod_memcpy_async(fab->dataPtr(), hostfab->dataPtr(), fab->size()*sizeof(Real));
          Gpu::streamSynchronize();
      }
#endif
    }

    VisMF::CloseStream(FullName);

    return fab;
}